

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall resetOnNewSessionFixture::~resetOnNewSessionFixture(resetOnNewSessionFixture *this)

{
  ~resetOnNewSessionFixture
            ((resetOnNewSessionFixture *)
             &this[-1].super_acceptorFixture.super_sessionFixture.factory);
  return;
}

Assistant:

resetOnNewSessionFixture() {
    now.setCurrent();
    startTime = now;
    startTime += -2;
    endTime = now;
    endTime += 2;

    acceptorFixture::createSession(0);
  }